

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<4,_16777232,_true,_embree::avx2::SubdivPatch1MBIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  RTCRayQueryContext *pRVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  uint uVar48;
  undefined1 (*pauVar49) [16];
  AABBNodeMB4D *node1;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  ulong uVar53;
  Geometry *pGVar54;
  uint uVar55;
  ulong uVar56;
  long lVar57;
  undefined1 (*pauVar58) [16];
  ulong uVar59;
  long lVar60;
  Primitive *prim;
  ulong uVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  undefined4 uVar64;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar111;
  float fVar112;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar143;
  float fVar144;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MapUV<embree::avx2::GridSOA::Gather3x3> mapUV;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  long local_1498;
  int local_1488;
  int local_1484;
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  undefined1 local_1460 [8];
  undefined1 auStack_1458 [8];
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined1 local_1440 [32];
  RTCFilterFunctionNArguments local_1410;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [48];
  float local_1390;
  undefined4 local_138c;
  undefined4 local_1388;
  float local_1384;
  float local_1380;
  undefined4 local_137c;
  undefined4 local_1378;
  uint local_1374;
  uint local_1370;
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined1 local_1330 [16];
  undefined1 (*local_1318) [16];
  ulong local_1310;
  ulong local_1308;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  float local_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [16];
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 (**local_1180) [16];
  undefined1 local_1160 [32];
  float local_1140 [4];
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  float local_1120 [4];
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar73 [64];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar49 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar77 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar85 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar78._8_4_ = 0x7fffffff;
    auVar78._0_8_ = 0x7fffffff7fffffff;
    auVar78._12_4_ = 0x7fffffff;
    auVar78 = vandps_avx((undefined1  [16])aVar1,auVar78);
    auVar96._8_4_ = 0x219392ef;
    auVar96._0_8_ = 0x219392ef219392ef;
    auVar96._12_4_ = 0x219392ef;
    auVar78 = vcmpps_avx(auVar78,auVar96,1);
    auVar97._8_4_ = 0x3f800000;
    auVar97._0_8_ = 0x3f8000003f800000;
    auVar97._12_4_ = 0x3f800000;
    auVar96 = vdivps_avx(auVar97,(undefined1  [16])aVar1);
    auVar98._8_4_ = 0x5d5e0b6b;
    auVar98._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar98._12_4_ = 0x5d5e0b6b;
    auVar78 = vblendvps_avx(auVar96,auVar98,auVar78);
    auVar90._0_4_ = auVar78._0_4_ * 0.99999964;
    auVar90._4_4_ = auVar78._4_4_ * 0.99999964;
    auVar90._8_4_ = auVar78._8_4_ * 0.99999964;
    auVar90._12_4_ = auVar78._12_4_ * 0.99999964;
    auVar84._0_4_ = auVar78._0_4_ * 1.0000004;
    auVar84._4_4_ = auVar78._4_4_ * 1.0000004;
    auVar84._8_4_ = auVar78._8_4_ * 1.0000004;
    auVar84._12_4_ = auVar78._12_4_ * 1.0000004;
    uVar64 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1210._4_4_ = uVar64;
    local_1210._0_4_ = uVar64;
    local_1210._8_4_ = uVar64;
    local_1210._12_4_ = uVar64;
    auVar125 = ZEXT1664(local_1210);
    uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1220._4_4_ = uVar64;
    local_1220._0_4_ = uVar64;
    local_1220._8_4_ = uVar64;
    local_1220._12_4_ = uVar64;
    auVar129 = ZEXT1664(local_1220);
    uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1230._4_4_ = uVar64;
    local_1230._0_4_ = uVar64;
    local_1230._8_4_ = uVar64;
    local_1230._12_4_ = uVar64;
    auVar131 = ZEXT1664(local_1230);
    auVar78 = vmovshdup_avx(auVar90);
    local_1250 = vshufps_avx(auVar90,auVar90,0x55);
    auVar136 = ZEXT1664(local_1250);
    auVar96 = vshufpd_avx(auVar90,auVar90,1);
    local_1260 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar139 = ZEXT1664(local_1260);
    local_1280 = vshufps_avx(auVar84,auVar84,0x55);
    auVar146 = ZEXT1664(local_1280);
    uVar63 = (ulong)(auVar90._0_4_ < 0.0) * 0x10;
    local_1290 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar154 = ZEXT1664(local_1290);
    uVar59 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x20;
    uVar53 = (ulong)(auVar96._0_4_ < 0.0) << 4 | 0x40;
    uVar64 = auVar77._0_4_;
    local_1330._4_4_ = uVar64;
    local_1330._0_4_ = uVar64;
    local_1330._8_4_ = uVar64;
    local_1330._12_4_ = uVar64;
    auVar121 = ZEXT1664(local_1330);
    local_1200 = mm_lookupmask_pd._0_8_;
    uStack_11f8 = mm_lookupmask_pd._8_8_;
    uStack_11f0 = mm_lookupmask_pd._0_8_;
    uStack_11e8 = mm_lookupmask_pd._8_8_;
    uVar64 = auVar85._0_4_;
    auVar73 = ZEXT1664(CONCAT412(uVar64,CONCAT48(uVar64,CONCAT44(uVar64,uVar64))));
    local_1498 = 0;
    local_1240 = auVar90._0_4_;
    fStack_123c = auVar90._0_4_;
    fStack_1238 = auVar90._0_4_;
    fStack_1234 = auVar90._0_4_;
    local_1270 = auVar84._0_4_;
    fStack_126c = auVar84._0_4_;
    fStack_1268 = auVar84._0_4_;
    fStack_1264 = auVar84._0_4_;
    fVar144 = auVar84._0_4_;
    fVar143 = auVar84._0_4_;
    fVar140 = auVar84._0_4_;
    fVar134 = auVar90._0_4_;
    fVar133 = auVar90._0_4_;
    fVar132 = auVar90._0_4_;
LAB_019306ed:
    do {
      pauVar58 = pauVar49 + -1;
      pauVar49 = pauVar49 + -1;
      if (*(float *)(*pauVar58 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar61 = *(ulong *)*pauVar49;
        while ((uVar61 & 8) == 0) {
          uVar50 = uVar61 & 0xfffffffffffffff0;
          uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar77._4_4_ = uVar64;
          auVar77._0_4_ = uVar64;
          auVar77._8_4_ = uVar64;
          auVar77._12_4_ = uVar64;
          auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar50 + 0x80 + uVar63),auVar77,
                                    *(undefined1 (*) [16])(uVar50 + 0x20 + uVar63));
          auVar78 = vsubps_avx(auVar78,auVar125._0_16_);
          auVar85._0_4_ = fVar132 * auVar78._0_4_;
          auVar85._4_4_ = fVar133 * auVar78._4_4_;
          auVar85._8_4_ = fVar134 * auVar78._8_4_;
          auVar85._12_4_ = auVar90._0_4_ * auVar78._12_4_;
          auVar78 = vmaxps_avx(auVar121._0_16_,auVar85);
          auVar96 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar50 + 0x80 + uVar59),auVar77,
                                    *(undefined1 (*) [16])(uVar50 + 0x20 + uVar59));
          auVar96 = vsubps_avx(auVar96,auVar129._0_16_);
          auVar91._0_4_ = auVar136._0_4_ * auVar96._0_4_;
          auVar91._4_4_ = auVar136._4_4_ * auVar96._4_4_;
          auVar91._8_4_ = auVar136._8_4_ * auVar96._8_4_;
          auVar91._12_4_ = auVar136._12_4_ * auVar96._12_4_;
          auVar96 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar50 + 0x80 + uVar53),auVar77,
                                    *(undefined1 (*) [16])(uVar50 + 0x20 + uVar53));
          auVar96 = vsubps_avx(auVar96,auVar131._0_16_);
          auVar99._0_4_ = auVar139._0_4_ * auVar96._0_4_;
          auVar99._4_4_ = auVar139._4_4_ * auVar96._4_4_;
          auVar99._8_4_ = auVar139._8_4_ * auVar96._8_4_;
          auVar99._12_4_ = auVar139._12_4_ * auVar96._12_4_;
          auVar96 = vmaxps_avx(auVar91,auVar99);
          local_11e0 = vmaxps_avx(auVar78,auVar96);
          auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar50 + 0x80 + (uVar63 ^ 0x10)),auVar77,
                                    *(undefined1 (*) [16])(uVar50 + 0x20 + (uVar63 ^ 0x10)));
          auVar78 = vsubps_avx(auVar78,auVar125._0_16_);
          auVar92._0_4_ = fVar140 * auVar78._0_4_;
          auVar92._4_4_ = fVar143 * auVar78._4_4_;
          auVar92._8_4_ = fVar144 * auVar78._8_4_;
          auVar92._12_4_ = auVar84._0_4_ * auVar78._12_4_;
          auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar50 + 0x80 + (uVar59 ^ 0x10)),auVar77,
                                    *(undefined1 (*) [16])(uVar50 + 0x20 + (uVar59 ^ 0x10)));
          auVar78 = vsubps_avx(auVar78,auVar129._0_16_);
          auVar96 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar50 + 0x80 + (uVar53 ^ 0x10)),auVar77,
                                    *(undefined1 (*) [16])(uVar50 + 0x20 + (uVar53 ^ 0x10)));
          auVar100._0_4_ = auVar146._0_4_ * auVar78._0_4_;
          auVar100._4_4_ = auVar146._4_4_ * auVar78._4_4_;
          auVar100._8_4_ = auVar146._8_4_ * auVar78._8_4_;
          auVar100._12_4_ = auVar146._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar96,auVar131._0_16_);
          auVar105._0_4_ = auVar154._0_4_ * auVar78._0_4_;
          auVar105._4_4_ = auVar154._4_4_ * auVar78._4_4_;
          auVar105._8_4_ = auVar154._8_4_ * auVar78._8_4_;
          auVar105._12_4_ = auVar154._12_4_ * auVar78._12_4_;
          auVar78 = vminps_avx(auVar100,auVar105);
          auVar96 = vminps_avx(auVar73._0_16_,auVar92);
          auVar78 = vminps_avx(auVar96,auVar78);
          if (((uint)uVar61 & 7) == 6) {
            auVar96 = vcmpps_avx(local_11e0,auVar78,2);
            auVar78 = vcmpps_avx(*(undefined1 (*) [16])(uVar50 + 0xe0),auVar77,2);
            auVar77 = vcmpps_avx(auVar77,*(undefined1 (*) [16])(uVar50 + 0xf0),1);
            auVar78 = vandps_avx(auVar78,auVar77);
            auVar78 = vandps_avx(auVar78,auVar96);
          }
          else {
            auVar78 = vcmpps_avx(local_11e0,auVar78,2);
          }
          auVar78 = vpslld_avx(auVar78,0x1f);
          uVar51 = vmovmskps_avx(auVar78);
          if (uVar51 == 0) {
            if (pauVar49 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            goto LAB_019306ed;
          }
          uVar51 = uVar51 & 0xff;
          lVar21 = 0;
          for (uVar61 = (ulong)uVar51; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000)
          {
            lVar21 = lVar21 + 1;
          }
          uVar61 = *(ulong *)(uVar50 + lVar21 * 8);
          uVar51 = uVar51 - 1 & uVar51;
          uVar52 = (ulong)uVar51;
          if (uVar51 != 0) {
            uVar48 = *(uint *)(local_11e0 + lVar21 * 4);
            lVar21 = 0;
            for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
            uVar51 = uVar51 - 1 & uVar51;
            uVar56 = (ulong)uVar51;
            uVar52 = *(ulong *)(uVar50 + lVar21 * 8);
            uVar2 = *(uint *)(local_11e0 + lVar21 * 4);
            if (uVar51 == 0) {
              if (uVar48 < uVar2) {
                *(ulong *)*pauVar49 = uVar52;
                *(uint *)(*pauVar49 + 8) = uVar2;
                pauVar49 = pauVar49 + 1;
              }
              else {
                *(ulong *)*pauVar49 = uVar61;
                *(uint *)(*pauVar49 + 8) = uVar48;
                pauVar49 = pauVar49 + 1;
                uVar61 = uVar52;
              }
            }
            else {
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar61;
              auVar78 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar48));
              auVar86._8_8_ = 0;
              auVar86._0_8_ = uVar52;
              auVar96 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar2));
              lVar21 = 0;
              for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
                lVar21 = lVar21 + 1;
              }
              uVar51 = uVar51 - 1 & uVar51;
              uVar61 = (ulong)uVar51;
              auVar93._8_8_ = 0;
              auVar93._0_8_ = *(ulong *)(uVar50 + lVar21 * 8);
              auVar85 = vpunpcklqdq_avx(auVar93,ZEXT416(*(uint *)(local_11e0 + lVar21 * 4)));
              auVar77 = vpcmpgtd_avx(auVar96,auVar78);
              if (uVar51 == 0) {
                auVar97 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar96,auVar78,auVar97);
                auVar78 = vblendvps_avx(auVar78,auVar96,auVar97);
                auVar96 = vpcmpgtd_avx(auVar85,auVar77);
                auVar97 = vpshufd_avx(auVar96,0xaa);
                auVar96 = vblendvps_avx(auVar85,auVar77,auVar97);
                auVar77 = vblendvps_avx(auVar77,auVar85,auVar97);
                auVar85 = vpcmpgtd_avx(auVar77,auVar78);
                auVar97 = vpshufd_avx(auVar85,0xaa);
                auVar85 = vblendvps_avx(auVar77,auVar78,auVar97);
                auVar78 = vblendvps_avx(auVar78,auVar77,auVar97);
                *pauVar49 = auVar78;
                pauVar49[1] = auVar85;
                uVar61 = auVar96._0_8_;
                pauVar49 = pauVar49 + 2;
              }
              else {
                lVar21 = 0;
                for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                  lVar21 = lVar21 + 1;
                }
                auVar106._8_8_ = 0;
                auVar106._0_8_ = *(ulong *)(uVar50 + lVar21 * 8);
                auVar98 = vpunpcklqdq_avx(auVar106,ZEXT416(*(uint *)(local_11e0 + lVar21 * 4)));
                auVar97 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar96,auVar78,auVar97);
                auVar78 = vblendvps_avx(auVar78,auVar96,auVar97);
                auVar96 = vpcmpgtd_avx(auVar98,auVar85);
                auVar97 = vpshufd_avx(auVar96,0xaa);
                auVar96 = vblendvps_avx(auVar98,auVar85,auVar97);
                auVar85 = vblendvps_avx(auVar85,auVar98,auVar97);
                auVar97 = vpcmpgtd_avx(auVar85,auVar78);
                auVar98 = vpshufd_avx(auVar97,0xaa);
                auVar97 = vblendvps_avx(auVar85,auVar78,auVar98);
                auVar78 = vblendvps_avx(auVar78,auVar85,auVar98);
                auVar85 = vpcmpgtd_avx(auVar96,auVar77);
                auVar98 = vpshufd_avx(auVar85,0xaa);
                auVar85 = vblendvps_avx(auVar96,auVar77,auVar98);
                auVar96 = vblendvps_avx(auVar77,auVar96,auVar98);
                auVar77 = vpcmpgtd_avx(auVar97,auVar96);
                auVar98 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar97,auVar96,auVar98);
                auVar96 = vblendvps_avx(auVar96,auVar97,auVar98);
                *pauVar49 = auVar78;
                pauVar49[1] = auVar96;
                pauVar49[2] = auVar77;
                auVar121 = ZEXT1664(local_1330);
                uVar61 = auVar85._0_8_;
                pauVar49 = pauVar49 + 3;
              }
            }
          }
        }
        if (((uint)uVar61 & 0xf) == 8) {
          uVar51 = *(uint *)(local_1498 + 0xc);
          local_1310 = (ulong)uVar51;
          uVar48 = *(uint *)(local_1498 + 0x10);
          lVar57 = (ulong)*(uint *)(local_1498 + 0x24) + local_1498 +
                   (long)local_1488 * (ulong)*(uint *)(local_1498 + 0x28);
          uVar61 = uVar61 >> 4;
          lVar21 = lVar57 + uVar61 * 4;
          lVar60 = lVar57 + uVar61 * 4 + 0x2c;
          auVar78 = *(undefined1 (*) [16])(lVar21 + 0x2c + local_1310 * 4);
          auVar96 = auVar78;
          if (2 < (ulong)uVar48) {
            auVar96 = *(undefined1 (*) [16])(lVar60 + local_1310 * 8);
          }
          auVar77 = *(undefined1 (*) [16])(lVar57 + 0x2c + uVar61 * 4);
          if (uVar51 == 2) {
            auVar77 = vshufps_avx(auVar77,auVar77,0x54);
            auVar78 = vshufps_avx(auVar78,auVar78,0x54);
            auVar96 = vshufps_avx(auVar96,auVar96,0x54);
          }
          uVar61 = (ulong)*(uint *)(local_1498 + 0x14);
          pauVar58 = (undefined1 (*) [16])(lVar21 + uVar61 * 4 + 0x2c);
          auVar85 = *(undefined1 (*) [16])(*pauVar58 + local_1310 * 4);
          auVar84 = auVar85;
          if (2 < uVar48) {
            auVar84 = *(undefined1 (*) [16])(*pauVar58 + local_1310 * 8);
          }
          auVar90 = *pauVar58;
          if (uVar51 == 2) {
            auVar90 = vshufps_avx(auVar90,auVar90,0x54);
            auVar85 = vshufps_avx(auVar85,auVar85,0x54);
            auVar84 = vshufps_avx(auVar84,auVar84,0x54);
          }
          pauVar62 = (undefined1 (*) [16])(lVar21 + uVar61 * 8 + 0x2c);
          auVar97 = *(undefined1 (*) [16])(*pauVar62 + local_1310 * 4);
          auVar98 = auVar97;
          if (2 < uVar48) {
            auVar98 = *(undefined1 (*) [16])(*pauVar62 + local_1310 * 8);
          }
          auVar91 = *pauVar62;
          if (uVar51 == 2) {
            auVar91 = vshufps_avx(auVar91,auVar91,0x54);
            auVar97 = vshufps_avx(auVar97,auVar97,0x54);
            auVar98 = vshufps_avx(auVar98,auVar98,0x54);
          }
          uVar50 = (ulong)(*(uint *)(local_1498 + 0x28) & 0xfffffffc);
          auVar92 = *(undefined1 (*) [16])(lVar60 + uVar50 + local_1310 * 4);
          auVar99 = auVar92;
          if (2 < uVar48) {
            auVar99 = *(undefined1 (*) [16])(lVar60 + uVar50 + local_1310 * 8);
          }
          auVar100 = *(undefined1 (*) [16])(lVar60 + uVar50);
          if (uVar51 == 2) {
            auVar100 = vshufps_avx(auVar100,auVar100,0x54);
            auVar92 = vshufps_avx(auVar92,auVar92,0x54);
            auVar99 = vshufps_avx(auVar99,auVar99,0x54);
          }
          pauVar58 = (undefined1 (*) [16])(*pauVar58 + uVar50);
          auVar105 = *(undefined1 (*) [16])(*pauVar58 + local_1310 * 4);
          auVar79 = auVar105;
          if (2 < uVar48) {
            auVar79 = *(undefined1 (*) [16])(*pauVar58 + local_1310 * 8);
          }
          _local_1480 = *pauVar58;
          if (uVar51 == 2) {
            _local_1480 = vshufps_avx(_local_1480,_local_1480,0x54);
            auVar105 = vshufps_avx(auVar105,auVar105,0x54);
            auVar79 = vshufps_avx(auVar79,auVar79,0x54);
          }
          pauVar58 = (undefined1 (*) [16])(*pauVar62 + uVar50);
          auVar86 = *pauVar58;
          auVar93 = *(undefined1 (*) [16])(*pauVar58 + local_1310 * 4);
          auVar106 = auVar93;
          if (2 < uVar48) {
            auVar106 = *(undefined1 (*) [16])(*pauVar58 + local_1310 * 8);
          }
          auVar69._16_16_ = auVar78;
          auVar69._0_16_ = auVar77;
          auVar65._16_16_ = auVar96;
          auVar65._0_16_ = auVar78;
          auVar16 = vunpcklps_avx(auVar69,auVar65);
          auVar69 = vshufps_avx(auVar69,auVar69,0xa5);
          auVar65 = vshufps_avx(auVar65,auVar65,0x94);
          auVar109._16_16_ = auVar85;
          auVar109._0_16_ = auVar90;
          auVar101._16_16_ = auVar84;
          auVar101._0_16_ = auVar85;
          auVar17 = vunpcklps_avx(auVar109,auVar101);
          auVar109 = vshufps_avx(auVar109,auVar109,0xa5);
          auVar101 = vshufps_avx(auVar101,auVar101,0x94);
          auVar120._16_16_ = auVar97;
          auVar120._0_16_ = auVar91;
          auVar117._16_16_ = auVar98;
          auVar117._0_16_ = auVar97;
          auVar18 = vunpcklps_avx(auVar120,auVar117);
          auVar120 = vshufps_avx(auVar120,auVar120,0xa5);
          auVar117 = vshufps_avx(auVar117,auVar117,0x94);
          auVar123._16_16_ = auVar92;
          auVar123._0_16_ = auVar100;
          auVar126._16_16_ = auVar99;
          auVar126._0_16_ = auVar92;
          auVar19 = vunpcklps_avx(auVar123,auVar126);
          auVar123 = vshufps_avx(auVar123,auVar123,0xa5);
          auVar126 = vshufps_avx(auVar126,auVar126,0x94);
          auVar128._16_16_ = auVar105;
          auVar128._0_16_ = _local_1480;
          auVar118._16_16_ = auVar79;
          auVar118._0_16_ = auVar105;
          auVar20 = vunpcklps_avx(auVar128,auVar118);
          auVar128 = vshufps_avx(auVar128,auVar128,0xa5);
          auVar118 = vshufps_avx(auVar118,auVar118,0x94);
          if (uVar51 == 2) {
            auVar86 = vshufps_avx(auVar86,auVar86,0x54);
            auVar93 = vshufps_avx(auVar93,auVar93,0x54);
            auVar106 = vshufps_avx(auVar106,auVar106,0x54);
          }
          auVar119._16_16_ = auVar93;
          auVar119._0_16_ = auVar86;
          auVar153._16_16_ = auVar106;
          auVar153._0_16_ = auVar93;
          fVar132 = 1.0 - (float)local_12a0._0_4_;
          auVar137._4_4_ = fVar132;
          auVar137._0_4_ = fVar132;
          auVar137._8_4_ = fVar132;
          auVar137._12_4_ = fVar132;
          auVar137._16_4_ = fVar132;
          auVar137._20_4_ = fVar132;
          auVar137._24_4_ = fVar132;
          auVar137._28_4_ = fVar132;
          auVar22._4_4_ = (float)local_12a0._0_4_ * auVar19._4_4_;
          auVar22._0_4_ = (float)local_12a0._0_4_ * auVar19._0_4_;
          auVar22._8_4_ = (float)local_12a0._0_4_ * auVar19._8_4_;
          auVar22._12_4_ = (float)local_12a0._0_4_ * auVar19._12_4_;
          auVar22._16_4_ = (float)local_12a0._0_4_ * auVar19._16_4_;
          auVar22._20_4_ = (float)local_12a0._0_4_ * auVar19._20_4_;
          auVar22._24_4_ = (float)local_12a0._0_4_ * auVar19._24_4_;
          auVar22._28_4_ = auVar19._28_4_;
          auVar78 = vfmadd213ps_fma(auVar16,auVar137,auVar22);
          auVar23._4_4_ = (float)local_12a0._0_4_ * auVar20._4_4_;
          auVar23._0_4_ = (float)local_12a0._0_4_ * auVar20._0_4_;
          auVar23._8_4_ = (float)local_12a0._0_4_ * auVar20._8_4_;
          auVar23._12_4_ = (float)local_12a0._0_4_ * auVar20._12_4_;
          auVar23._16_4_ = (float)local_12a0._0_4_ * auVar20._16_4_;
          auVar23._20_4_ = (float)local_12a0._0_4_ * auVar20._20_4_;
          auVar23._24_4_ = (float)local_12a0._0_4_ * auVar20._24_4_;
          auVar23._28_4_ = auVar19._28_4_;
          auVar96 = vfmadd213ps_fma(auVar17,auVar137,auVar23);
          auVar16 = vunpcklps_avx(auVar119,auVar153);
          auVar17._4_4_ = (float)local_12a0._0_4_ * auVar16._4_4_;
          auVar17._0_4_ = (float)local_12a0._0_4_ * auVar16._0_4_;
          auVar17._8_4_ = (float)local_12a0._0_4_ * auVar16._8_4_;
          auVar17._12_4_ = (float)local_12a0._0_4_ * auVar16._12_4_;
          auVar17._16_4_ = (float)local_12a0._0_4_ * auVar16._16_4_;
          auVar17._20_4_ = (float)local_12a0._0_4_ * auVar16._20_4_;
          auVar17._24_4_ = (float)local_12a0._0_4_ * auVar16._24_4_;
          auVar17._28_4_ = auVar16._28_4_;
          auVar77 = vfmadd213ps_fma(auVar18,auVar137,auVar17);
          local_1360._0_4_ = auVar123._0_4_;
          local_1360._4_4_ = auVar123._4_4_;
          fStack_1358 = auVar123._8_4_;
          fStack_1354 = auVar123._12_4_;
          fStack_1350 = auVar123._16_4_;
          fStack_134c = auVar123._20_4_;
          fStack_1348 = auVar123._24_4_;
          auVar18._4_4_ = (float)local_12a0._0_4_ * (float)local_1360._4_4_;
          auVar18._0_4_ = (float)local_12a0._0_4_ * (float)local_1360._0_4_;
          auVar18._8_4_ = (float)local_12a0._0_4_ * fStack_1358;
          auVar18._12_4_ = (float)local_12a0._0_4_ * fStack_1354;
          auVar18._16_4_ = (float)local_12a0._0_4_ * fStack_1350;
          auVar18._20_4_ = (float)local_12a0._0_4_ * fStack_134c;
          auVar18._24_4_ = (float)local_12a0._0_4_ * fStack_1348;
          auVar18._28_4_ = auVar16._28_4_;
          auVar85 = vfmadd213ps_fma(auVar69,auVar137,auVar18);
          auVar69 = vshufps_avx(auVar119,auVar119,0xa5);
          auVar123 = vshufps_avx(auVar153,auVar153,0x94);
          local_1480._0_4_ = auVar128._0_4_;
          local_1480._4_4_ = auVar128._4_4_;
          fStack_1478 = auVar128._8_4_;
          fStack_1474 = auVar128._12_4_;
          fStack_1470 = auVar128._16_4_;
          fStack_146c = auVar128._20_4_;
          fStack_1468 = auVar128._24_4_;
          auVar141._0_4_ = (float)local_12a0._0_4_ * (float)local_1480._0_4_;
          auVar141._4_4_ = (float)local_12a0._0_4_ * (float)local_1480._4_4_;
          auVar141._8_4_ = (float)local_12a0._0_4_ * fStack_1478;
          auVar141._12_4_ = (float)local_12a0._0_4_ * fStack_1474;
          auVar141._16_4_ = (float)local_12a0._0_4_ * fStack_1470;
          auVar141._20_4_ = (float)local_12a0._0_4_ * fStack_146c;
          auVar141._24_4_ = (float)local_12a0._0_4_ * fStack_1468;
          auVar141._28_4_ = 0;
          auVar19._4_4_ = (float)local_12a0._0_4_ * auVar69._4_4_;
          auVar19._0_4_ = (float)local_12a0._0_4_ * auVar69._0_4_;
          auVar19._8_4_ = (float)local_12a0._0_4_ * auVar69._8_4_;
          auVar19._12_4_ = (float)local_12a0._0_4_ * auVar69._12_4_;
          auVar19._16_4_ = (float)local_12a0._0_4_ * auVar69._16_4_;
          auVar19._20_4_ = (float)local_12a0._0_4_ * auVar69._20_4_;
          auVar19._24_4_ = (float)local_12a0._0_4_ * auVar69._24_4_;
          auVar19._28_4_ = auVar69._28_4_;
          auVar84 = vfmadd213ps_fma(auVar109,auVar137,auVar141);
          auVar90 = vfmadd213ps_fma(auVar120,auVar137,auVar19);
          local_1460._0_4_ = auVar126._0_4_;
          local_1460._4_4_ = auVar126._4_4_;
          auStack_1458._0_4_ = auVar126._8_4_;
          auStack_1458._4_4_ = auVar126._12_4_;
          fStack_1450 = auVar126._16_4_;
          fStack_144c = auVar126._20_4_;
          fStack_1448 = auVar126._24_4_;
          auVar20._4_4_ = (float)local_12a0._0_4_ * (float)local_1460._4_4_;
          auVar20._0_4_ = (float)local_12a0._0_4_ * (float)local_1460._0_4_;
          auVar20._8_4_ = (float)local_12a0._0_4_ * (float)auStack_1458._0_4_;
          auVar20._12_4_ = (float)local_12a0._0_4_ * (float)auStack_1458._4_4_;
          auVar20._16_4_ = (float)local_12a0._0_4_ * fStack_1450;
          auVar20._20_4_ = (float)local_12a0._0_4_ * fStack_144c;
          auVar20._24_4_ = (float)local_12a0._0_4_ * fStack_1448;
          auVar20._28_4_ = auVar69._28_4_;
          auVar24._4_4_ = (float)local_12a0._0_4_ * auVar118._4_4_;
          auVar24._0_4_ = (float)local_12a0._0_4_ * auVar118._0_4_;
          auVar24._8_4_ = (float)local_12a0._0_4_ * auVar118._8_4_;
          auVar24._12_4_ = (float)local_12a0._0_4_ * auVar118._12_4_;
          auVar24._16_4_ = (float)local_12a0._0_4_ * auVar118._16_4_;
          auVar24._20_4_ = (float)local_12a0._0_4_ * auVar118._20_4_;
          auVar24._24_4_ = (float)local_12a0._0_4_ * auVar118._24_4_;
          auVar24._28_4_ = 0;
          auVar25._4_4_ = (float)local_12a0._0_4_ * auVar123._4_4_;
          auVar25._0_4_ = (float)local_12a0._0_4_ * auVar123._0_4_;
          auVar25._8_4_ = (float)local_12a0._0_4_ * auVar123._8_4_;
          auVar25._12_4_ = (float)local_12a0._0_4_ * auVar123._12_4_;
          auVar25._16_4_ = (float)local_12a0._0_4_ * auVar123._16_4_;
          auVar25._20_4_ = (float)local_12a0._0_4_ * auVar123._20_4_;
          auVar25._24_4_ = (float)local_12a0._0_4_ * auVar123._24_4_;
          auVar25._28_4_ = local_12a0._0_4_;
          auVar97 = vfmadd213ps_fma(auVar65,auVar137,auVar20);
          auVar98 = vfmadd213ps_fma(auVar101,auVar137,auVar24);
          auVar91 = vfmadd213ps_fma(auVar117,auVar137,auVar25);
          uVar64 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar130._4_4_ = uVar64;
          auVar130._0_4_ = uVar64;
          auVar130._8_4_ = uVar64;
          auVar130._12_4_ = uVar64;
          auVar130._16_4_ = uVar64;
          auVar130._20_4_ = uVar64;
          auVar130._24_4_ = uVar64;
          auVar130._28_4_ = uVar64;
          uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar138._4_4_ = uVar64;
          auVar138._0_4_ = uVar64;
          auVar138._8_4_ = uVar64;
          auVar138._12_4_ = uVar64;
          auVar138._16_4_ = uVar64;
          auVar138._20_4_ = uVar64;
          auVar138._24_4_ = uVar64;
          auVar138._28_4_ = uVar64;
          uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar142._4_4_ = uVar64;
          auVar142._0_4_ = uVar64;
          auVar142._8_4_ = uVar64;
          auVar142._12_4_ = uVar64;
          auVar142._16_4_ = uVar64;
          auVar142._20_4_ = uVar64;
          auVar142._24_4_ = uVar64;
          auVar142._28_4_ = uVar64;
          _local_1460 = vsubps_avx(ZEXT1632(auVar78),auVar130);
          _local_1480 = vsubps_avx(ZEXT1632(auVar96),auVar138);
          _local_1360 = vsubps_avx(ZEXT1632(auVar77),auVar142);
          auVar69 = vsubps_avx(ZEXT1632(auVar85),auVar130);
          auVar65 = vsubps_avx(ZEXT1632(auVar84),auVar138);
          auVar109 = vsubps_avx(ZEXT1632(auVar90),auVar142);
          auVar101 = vsubps_avx(ZEXT1632(auVar97),auVar130);
          auVar120 = vsubps_avx(ZEXT1632(auVar98),auVar138);
          auVar117 = vsubps_avx(ZEXT1632(auVar91),auVar142);
          local_13e0 = vsubps_avx(auVar101,_local_1460);
          local_1300 = vsubps_avx(auVar120,_local_1480);
          local_12e0 = vsubps_avx(auVar117,_local_1360);
          auVar66._0_4_ = local_1460._0_4_ + auVar101._0_4_;
          auVar66._4_4_ = local_1460._4_4_ + auVar101._4_4_;
          auVar66._8_4_ = local_1460._8_4_ + auVar101._8_4_;
          auVar66._12_4_ = local_1460._12_4_ + auVar101._12_4_;
          auVar66._16_4_ = local_1460._16_4_ + auVar101._16_4_;
          auVar66._20_4_ = local_1460._20_4_ + auVar101._20_4_;
          auVar66._24_4_ = local_1460._24_4_ + auVar101._24_4_;
          auVar66._28_4_ = local_1460._28_4_ + auVar101._28_4_;
          auVar80._0_4_ = local_1480._0_4_ + auVar120._0_4_;
          auVar80._4_4_ = local_1480._4_4_ + auVar120._4_4_;
          auVar80._8_4_ = local_1480._8_4_ + auVar120._8_4_;
          auVar80._12_4_ = local_1480._12_4_ + auVar120._12_4_;
          auVar80._16_4_ = local_1480._16_4_ + auVar120._16_4_;
          auVar80._20_4_ = local_1480._20_4_ + auVar120._20_4_;
          auVar80._24_4_ = local_1480._24_4_ + auVar120._24_4_;
          auVar84._0_4_ = auVar120._28_4_;
          auVar80._28_4_ = local_1480._28_4_ + auVar84._0_4_;
          fVar132 = local_1360._0_4_;
          auVar102._0_4_ = auVar117._0_4_ + fVar132;
          fVar133 = local_1360._4_4_;
          auVar102._4_4_ = auVar117._4_4_ + fVar133;
          fVar134 = local_1360._8_4_;
          auVar102._8_4_ = auVar117._8_4_ + fVar134;
          auVar90._0_4_ = local_1360._12_4_;
          auVar102._12_4_ = auVar117._12_4_ + auVar90._0_4_;
          fVar140 = local_1360._16_4_;
          auVar102._16_4_ = auVar117._16_4_ + fVar140;
          fVar143 = local_1360._20_4_;
          auVar102._20_4_ = auVar117._20_4_ + fVar143;
          fVar144 = local_1360._24_4_;
          auVar102._24_4_ = auVar117._24_4_ + fVar144;
          fVar74 = local_1360._28_4_;
          auVar102._28_4_ = auVar117._28_4_ + fVar74;
          auVar26._4_4_ = local_12e0._4_4_ * auVar80._4_4_;
          auVar26._0_4_ = local_12e0._0_4_ * auVar80._0_4_;
          auVar26._8_4_ = local_12e0._8_4_ * auVar80._8_4_;
          auVar26._12_4_ = local_12e0._12_4_ * auVar80._12_4_;
          auVar26._16_4_ = local_12e0._16_4_ * auVar80._16_4_;
          auVar26._20_4_ = local_12e0._20_4_ * auVar80._20_4_;
          auVar26._24_4_ = local_12e0._24_4_ * auVar80._24_4_;
          auVar26._28_4_ = uVar64;
          auVar96 = vfmsub231ps_fma(auVar26,local_1300,auVar102);
          auVar27._4_4_ = local_13e0._4_4_ * auVar102._4_4_;
          auVar27._0_4_ = local_13e0._0_4_ * auVar102._0_4_;
          auVar27._8_4_ = local_13e0._8_4_ * auVar102._8_4_;
          auVar27._12_4_ = local_13e0._12_4_ * auVar102._12_4_;
          auVar27._16_4_ = local_13e0._16_4_ * auVar102._16_4_;
          auVar27._20_4_ = local_13e0._20_4_ * auVar102._20_4_;
          auVar27._24_4_ = local_13e0._24_4_ * auVar102._24_4_;
          auVar27._28_4_ = auVar102._28_4_;
          auVar78 = vfmsub231ps_fma(auVar27,local_12e0,auVar66);
          auVar28._4_4_ = local_1300._4_4_ * auVar66._4_4_;
          auVar28._0_4_ = local_1300._0_4_ * auVar66._0_4_;
          auVar28._8_4_ = local_1300._8_4_ * auVar66._8_4_;
          auVar28._12_4_ = local_1300._12_4_ * auVar66._12_4_;
          auVar28._16_4_ = local_1300._16_4_ * auVar66._16_4_;
          auVar28._20_4_ = local_1300._20_4_ * auVar66._20_4_;
          auVar28._24_4_ = local_1300._24_4_ * auVar66._24_4_;
          auVar28._28_4_ = auVar66._28_4_;
          local_fc0 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar77 = vfmsub231ps_fma(auVar28,local_13e0,auVar80);
          auVar29._4_4_ = local_fc0 * auVar77._4_4_;
          auVar29._0_4_ = local_fc0 * auVar77._0_4_;
          auVar29._8_4_ = local_fc0 * auVar77._8_4_;
          auVar29._12_4_ = local_fc0 * auVar77._12_4_;
          auVar29._16_4_ = local_fc0 * 0.0;
          auVar29._20_4_ = local_fc0 * 0.0;
          auVar29._24_4_ = local_fc0 * 0.0;
          auVar29._28_4_ = local_13e0._28_4_;
          uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          local_13c0._4_4_ = uVar64;
          local_13c0._0_4_ = uVar64;
          local_13c0._8_4_ = uVar64;
          local_13c0._12_4_ = uVar64;
          local_13c0._16_4_ = uVar64;
          local_13c0._20_4_ = uVar64;
          local_13c0._24_4_ = uVar64;
          local_13c0._28_4_ = uVar64;
          auVar78 = vfmadd231ps_fma(auVar29,local_13c0._0_32_,ZEXT1632(auVar78));
          uVar64 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          local_fe0._4_4_ = uVar64;
          local_fe0._0_4_ = uVar64;
          local_fe0._8_4_ = uVar64;
          local_fe0._12_4_ = uVar64;
          local_fe0._16_4_ = uVar64;
          local_fe0._20_4_ = uVar64;
          local_fe0._24_4_ = uVar64;
          local_fe0._28_4_ = uVar64;
          local_11e0 = vfmadd231ps_fma(ZEXT1632(auVar78),local_fe0,ZEXT1632(auVar96));
          local_1000 = vsubps_avx(_local_1480,auVar65);
          local_1020 = vsubps_avx(_local_1360,auVar109);
          auVar81._0_4_ = local_1480._0_4_ + auVar65._0_4_;
          auVar81._4_4_ = local_1480._4_4_ + auVar65._4_4_;
          auVar81._8_4_ = local_1480._8_4_ + auVar65._8_4_;
          auVar81._12_4_ = local_1480._12_4_ + auVar65._12_4_;
          auVar81._16_4_ = local_1480._16_4_ + auVar65._16_4_;
          auVar81._20_4_ = local_1480._20_4_ + auVar65._20_4_;
          auVar81._24_4_ = local_1480._24_4_ + auVar65._24_4_;
          auVar81._28_4_ = local_1480._28_4_ + auVar65._28_4_;
          auVar103._0_4_ = fVar132 + auVar109._0_4_;
          auVar103._4_4_ = fVar133 + auVar109._4_4_;
          auVar103._8_4_ = fVar134 + auVar109._8_4_;
          auVar103._12_4_ = auVar90._0_4_ + auVar109._12_4_;
          auVar103._16_4_ = fVar140 + auVar109._16_4_;
          auVar103._20_4_ = fVar143 + auVar109._20_4_;
          auVar103._24_4_ = fVar144 + auVar109._24_4_;
          auVar103._28_4_ = fVar74 + auVar109._28_4_;
          fVar75 = local_1020._0_4_;
          fVar76 = local_1020._4_4_;
          auVar30._4_4_ = auVar81._4_4_ * fVar76;
          auVar30._0_4_ = auVar81._0_4_ * fVar75;
          fVar6 = local_1020._8_4_;
          auVar30._8_4_ = auVar81._8_4_ * fVar6;
          fVar8 = local_1020._12_4_;
          auVar30._12_4_ = auVar81._12_4_ * fVar8;
          fVar10 = local_1020._16_4_;
          auVar30._16_4_ = auVar81._16_4_ * fVar10;
          fVar12 = local_1020._20_4_;
          auVar30._20_4_ = auVar81._20_4_ * fVar12;
          fVar14 = local_1020._24_4_;
          auVar30._24_4_ = auVar81._24_4_ * fVar14;
          auVar30._28_4_ = fVar74;
          auVar96 = vfmsub231ps_fma(auVar30,local_1000,auVar103);
          auVar123 = vsubps_avx(_local_1460,auVar69);
          fVar145 = auVar123._0_4_;
          fVar147 = auVar123._4_4_;
          auVar31._4_4_ = fVar147 * auVar103._4_4_;
          auVar31._0_4_ = fVar145 * auVar103._0_4_;
          fVar148 = auVar123._8_4_;
          auVar31._8_4_ = fVar148 * auVar103._8_4_;
          fVar149 = auVar123._12_4_;
          auVar31._12_4_ = fVar149 * auVar103._12_4_;
          fVar150 = auVar123._16_4_;
          auVar31._16_4_ = fVar150 * auVar103._16_4_;
          fVar151 = auVar123._20_4_;
          auVar31._20_4_ = fVar151 * auVar103._20_4_;
          fVar152 = auVar123._24_4_;
          auVar31._24_4_ = fVar152 * auVar103._24_4_;
          auVar31._28_4_ = auVar103._28_4_;
          auVar135._0_4_ = local_1460._0_4_ + auVar69._0_4_;
          auVar135._4_4_ = local_1460._4_4_ + auVar69._4_4_;
          auVar135._8_4_ = local_1460._8_4_ + auVar69._8_4_;
          auVar135._12_4_ = local_1460._12_4_ + auVar69._12_4_;
          auVar135._16_4_ = local_1460._16_4_ + auVar69._16_4_;
          auVar135._20_4_ = local_1460._20_4_ + auVar69._20_4_;
          auVar135._24_4_ = local_1460._24_4_ + auVar69._24_4_;
          auVar135._28_4_ = local_1460._28_4_ + auVar69._28_4_;
          auVar78 = vfmsub231ps_fma(auVar31,local_1020,auVar135);
          fVar74 = local_1000._0_4_;
          fVar5 = local_1000._4_4_;
          auVar32._4_4_ = auVar135._4_4_ * fVar5;
          auVar32._0_4_ = auVar135._0_4_ * fVar74;
          fVar7 = local_1000._8_4_;
          auVar32._8_4_ = auVar135._8_4_ * fVar7;
          fVar9 = local_1000._12_4_;
          auVar32._12_4_ = auVar135._12_4_ * fVar9;
          fVar11 = local_1000._16_4_;
          auVar32._16_4_ = auVar135._16_4_ * fVar11;
          fVar13 = local_1000._20_4_;
          auVar32._20_4_ = auVar135._20_4_ * fVar13;
          fVar15 = local_1000._24_4_;
          auVar32._24_4_ = auVar135._24_4_ * fVar15;
          auVar32._28_4_ = local_1020._28_4_;
          auVar77 = vfmsub231ps_fma(auVar32,auVar123,auVar81);
          auVar33._4_4_ = local_fc0 * auVar77._4_4_;
          auVar33._0_4_ = local_fc0 * auVar77._0_4_;
          auVar33._8_4_ = local_fc0 * auVar77._8_4_;
          auVar33._12_4_ = local_fc0 * auVar77._12_4_;
          auVar33._16_4_ = local_fc0 * 0.0;
          auVar33._20_4_ = local_fc0 * 0.0;
          auVar33._24_4_ = local_fc0 * 0.0;
          auVar33._28_4_ = auVar81._28_4_;
          auVar78 = vfmadd231ps_fma(auVar33,local_13c0._0_32_,ZEXT1632(auVar78));
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_fe0,ZEXT1632(auVar96));
          auVar126 = vsubps_avx(auVar69,auVar101);
          auVar67._0_4_ = auVar69._0_4_ + auVar101._0_4_;
          auVar67._4_4_ = auVar69._4_4_ + auVar101._4_4_;
          auVar67._8_4_ = auVar69._8_4_ + auVar101._8_4_;
          auVar67._12_4_ = auVar69._12_4_ + auVar101._12_4_;
          auVar67._16_4_ = auVar69._16_4_ + auVar101._16_4_;
          auVar67._20_4_ = auVar69._20_4_ + auVar101._20_4_;
          auVar67._24_4_ = auVar69._24_4_ + auVar101._24_4_;
          auVar67._28_4_ = auVar69._28_4_ + auVar101._28_4_;
          auVar101 = vsubps_avx(auVar65,auVar120);
          auVar94._0_4_ = auVar65._0_4_ + auVar120._0_4_;
          auVar94._4_4_ = auVar65._4_4_ + auVar120._4_4_;
          auVar94._8_4_ = auVar65._8_4_ + auVar120._8_4_;
          auVar94._12_4_ = auVar65._12_4_ + auVar120._12_4_;
          auVar94._16_4_ = auVar65._16_4_ + auVar120._16_4_;
          auVar94._20_4_ = auVar65._20_4_ + auVar120._20_4_;
          auVar94._24_4_ = auVar65._24_4_ + auVar120._24_4_;
          auVar94._28_4_ = auVar65._28_4_ + auVar84._0_4_;
          auVar120 = vsubps_avx(auVar109,auVar117);
          auVar87._0_4_ = auVar109._0_4_ + auVar117._0_4_;
          auVar87._4_4_ = auVar109._4_4_ + auVar117._4_4_;
          auVar87._8_4_ = auVar109._8_4_ + auVar117._8_4_;
          auVar87._12_4_ = auVar109._12_4_ + auVar117._12_4_;
          auVar87._16_4_ = auVar109._16_4_ + auVar117._16_4_;
          auVar87._20_4_ = auVar109._20_4_ + auVar117._20_4_;
          auVar87._24_4_ = auVar109._24_4_ + auVar117._24_4_;
          auVar87._28_4_ = auVar109._28_4_ + auVar117._28_4_;
          auVar34._4_4_ = auVar120._4_4_ * auVar94._4_4_;
          auVar34._0_4_ = auVar120._0_4_ * auVar94._0_4_;
          auVar34._8_4_ = auVar120._8_4_ * auVar94._8_4_;
          auVar34._12_4_ = auVar120._12_4_ * auVar94._12_4_;
          auVar34._16_4_ = auVar120._16_4_ * auVar94._16_4_;
          auVar34._20_4_ = auVar120._20_4_ * auVar94._20_4_;
          auVar34._24_4_ = auVar120._24_4_ * auVar94._24_4_;
          auVar34._28_4_ = auVar84._0_4_;
          auVar77 = vfmsub231ps_fma(auVar34,auVar101,auVar87);
          auVar35._4_4_ = auVar87._4_4_ * auVar126._4_4_;
          auVar35._0_4_ = auVar87._0_4_ * auVar126._0_4_;
          auVar35._8_4_ = auVar87._8_4_ * auVar126._8_4_;
          auVar35._12_4_ = auVar87._12_4_ * auVar126._12_4_;
          auVar35._16_4_ = auVar87._16_4_ * auVar126._16_4_;
          auVar35._20_4_ = auVar87._20_4_ * auVar126._20_4_;
          auVar35._24_4_ = auVar87._24_4_ * auVar126._24_4_;
          auVar35._28_4_ = auVar87._28_4_;
          auVar96 = vfmsub231ps_fma(auVar35,auVar120,auVar67);
          auVar36._4_4_ = auVar101._4_4_ * auVar67._4_4_;
          auVar36._0_4_ = auVar101._0_4_ * auVar67._0_4_;
          auVar36._8_4_ = auVar101._8_4_ * auVar67._8_4_;
          auVar36._12_4_ = auVar101._12_4_ * auVar67._12_4_;
          auVar36._16_4_ = auVar101._16_4_ * auVar67._16_4_;
          auVar36._20_4_ = auVar101._20_4_ * auVar67._20_4_;
          auVar36._24_4_ = auVar101._24_4_ * auVar67._24_4_;
          auVar36._28_4_ = auVar67._28_4_;
          auVar85 = vfmsub231ps_fma(auVar36,auVar126,auVar94);
          fStack_fbc = local_fc0;
          fStack_fb8 = local_fc0;
          fStack_fb4 = local_fc0;
          fStack_fb0 = local_fc0;
          fStack_fac = local_fc0;
          fStack_fa8 = local_fc0;
          fStack_fa4 = local_fc0;
          auVar68._0_4_ = local_fc0 * auVar85._0_4_;
          auVar68._4_4_ = local_fc0 * auVar85._4_4_;
          auVar68._8_4_ = local_fc0 * auVar85._8_4_;
          auVar68._12_4_ = local_fc0 * auVar85._12_4_;
          auVar68._16_4_ = local_fc0 * 0.0;
          auVar68._20_4_ = local_fc0 * 0.0;
          auVar68._24_4_ = local_fc0 * 0.0;
          auVar68._28_4_ = 0;
          auVar96 = vfmadd231ps_fma(auVar68,local_13c0._0_32_,ZEXT1632(auVar96));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),local_fe0,ZEXT1632(auVar77));
          local_11a0 = ZEXT1632(CONCAT412(auVar96._12_4_ + local_11e0._12_4_ + auVar78._12_4_,
                                          CONCAT48(auVar96._8_4_ + local_11e0._8_4_ + auVar78._8_4_,
                                                   CONCAT44(auVar96._4_4_ +
                                                            local_11e0._4_4_ + auVar78._4_4_,
                                                            auVar96._0_4_ +
                                                            local_11e0._0_4_ + auVar78._0_4_))));
          local_1440 = ZEXT1632(local_11e0);
          auVar69 = vminps_avx(local_1440,ZEXT1632(auVar78));
          auVar69 = vminps_avx(auVar69,ZEXT1632(auVar96));
          auVar88._8_4_ = 0x7fffffff;
          auVar88._0_8_ = 0x7fffffff7fffffff;
          auVar88._12_4_ = 0x7fffffff;
          auVar88._16_4_ = 0x7fffffff;
          auVar88._20_4_ = 0x7fffffff;
          auVar88._24_4_ = 0x7fffffff;
          auVar88._28_4_ = 0x7fffffff;
          local_1080 = vandps_avx(local_11a0,auVar88);
          auVar84._0_4_ = local_1080._0_4_ * 1.1920929e-07;
          fVar111 = local_1080._4_4_ * 1.1920929e-07;
          auVar37._4_4_ = fVar111;
          auVar37._0_4_ = auVar84._0_4_;
          fVar112 = local_1080._8_4_ * 1.1920929e-07;
          auVar37._8_4_ = fVar112;
          fVar113 = local_1080._12_4_ * 1.1920929e-07;
          auVar37._12_4_ = fVar113;
          fVar114 = local_1080._16_4_ * 1.1920929e-07;
          auVar37._16_4_ = fVar114;
          fVar115 = local_1080._20_4_ * 1.1920929e-07;
          auVar37._20_4_ = fVar115;
          fVar116 = local_1080._24_4_ * 1.1920929e-07;
          auVar37._24_4_ = fVar116;
          auVar37._28_4_ = 0x34000000;
          auVar122._0_8_ = CONCAT44(fVar111,auVar84._0_4_) ^ 0x8000000080000000;
          auVar122._8_4_ = -fVar112;
          auVar122._12_4_ = -fVar113;
          auVar122._16_4_ = -fVar114;
          auVar122._20_4_ = -fVar115;
          auVar122._24_4_ = -fVar116;
          auVar122._28_4_ = 0xb4000000;
          auVar69 = vcmpps_avx(auVar69,auVar122,5);
          auVar109 = vmaxps_avx(local_1440,ZEXT1632(auVar78));
          auVar65 = vmaxps_avx(auVar109,ZEXT1632(auVar96));
          auVar65 = vcmpps_avx(auVar65,auVar37,2);
          local_1040 = vorps_avx(auVar69,auVar65);
          local_1318 = (undefined1 (*) [16])(lVar21 + 0x2c + uVar61 * 0xc);
          local_1308 = (ulong)uVar48;
          auVar16._8_8_ = uStack_11f8;
          auVar16._0_8_ = local_1200;
          auVar16._16_8_ = uStack_11f0;
          auVar16._24_8_ = uStack_11e8;
          auVar16 = auVar16 & local_1040;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            local_1060 = 0x80000000;
            uStack_105c = 0x80000000;
            uStack_1058 = 0x80000000;
            uStack_1054 = 0x80000000;
            uStack_1050 = 0x80000000;
            uStack_104c = 0x80000000;
            uStack_1048 = 0x80000000;
            uStack_1044 = 0x80000000;
            auVar38._4_4_ = local_12e0._4_4_ * fVar5;
            auVar38._0_4_ = local_12e0._0_4_ * fVar74;
            auVar38._8_4_ = local_12e0._8_4_ * fVar7;
            auVar38._12_4_ = local_12e0._12_4_ * fVar9;
            auVar38._16_4_ = local_12e0._16_4_ * fVar11;
            auVar38._20_4_ = local_12e0._20_4_ * fVar13;
            auVar38._24_4_ = local_12e0._24_4_ * fVar15;
            auVar38._28_4_ = local_1040._28_4_;
            auVar39._4_4_ = local_1300._4_4_ * fVar147;
            auVar39._0_4_ = local_1300._0_4_ * fVar145;
            auVar39._8_4_ = local_1300._8_4_ * fVar148;
            auVar39._12_4_ = local_1300._12_4_ * fVar149;
            auVar39._16_4_ = local_1300._16_4_ * fVar150;
            auVar39._20_4_ = local_1300._20_4_ * fVar151;
            auVar39._24_4_ = local_1300._24_4_ * fVar152;
            auVar39._28_4_ = auVar69._28_4_;
            auVar96 = vfmsub213ps_fma(local_1300,local_1020,auVar38);
            auVar40._4_4_ = fVar76 * auVar101._4_4_;
            auVar40._0_4_ = fVar75 * auVar101._0_4_;
            auVar40._8_4_ = fVar6 * auVar101._8_4_;
            auVar40._12_4_ = fVar8 * auVar101._12_4_;
            auVar40._16_4_ = fVar10 * auVar101._16_4_;
            auVar40._20_4_ = fVar12 * auVar101._20_4_;
            auVar40._24_4_ = fVar14 * auVar101._24_4_;
            auVar40._28_4_ = 0x34000000;
            auVar41._4_4_ = fVar147 * auVar120._4_4_;
            auVar41._0_4_ = fVar145 * auVar120._0_4_;
            auVar41._8_4_ = fVar148 * auVar120._8_4_;
            auVar41._12_4_ = fVar149 * auVar120._12_4_;
            auVar41._16_4_ = fVar150 * auVar120._16_4_;
            auVar41._20_4_ = fVar151 * auVar120._20_4_;
            auVar41._24_4_ = fVar152 * auVar120._24_4_;
            auVar41._28_4_ = auVar109._28_4_;
            auVar77 = vfmsub213ps_fma(auVar120,local_1000,auVar40);
            auVar69 = vandps_avx(auVar38,auVar88);
            auVar65 = vandps_avx(auVar40,auVar88);
            auVar69 = vcmpps_avx(auVar69,auVar65,1);
            local_10e0 = vblendvps_avx(ZEXT1632(auVar77),ZEXT1632(auVar96),auVar69);
            auVar42._4_4_ = fVar5 * auVar126._4_4_;
            auVar42._0_4_ = fVar74 * auVar126._0_4_;
            auVar42._8_4_ = fVar7 * auVar126._8_4_;
            auVar42._12_4_ = fVar9 * auVar126._12_4_;
            auVar42._16_4_ = fVar11 * auVar126._16_4_;
            auVar42._20_4_ = fVar13 * auVar126._20_4_;
            auVar42._24_4_ = fVar15 * auVar126._24_4_;
            auVar42._28_4_ = auVar69._28_4_;
            auVar96 = vfmsub213ps_fma(auVar126,local_1020,auVar41);
            auVar43._4_4_ = local_13e0._4_4_ * fVar76;
            auVar43._0_4_ = local_13e0._0_4_ * fVar75;
            auVar43._8_4_ = local_13e0._8_4_ * fVar6;
            auVar43._12_4_ = local_13e0._12_4_ * fVar8;
            auVar43._16_4_ = local_13e0._16_4_ * fVar10;
            auVar43._20_4_ = local_13e0._20_4_ * fVar12;
            auVar43._24_4_ = local_13e0._24_4_ * fVar14;
            auVar43._28_4_ = auVar65._28_4_;
            auVar77 = vfmsub213ps_fma(local_12e0,auVar123,auVar43);
            auVar69 = vandps_avx(auVar43,auVar88);
            auVar65 = vandps_avx(auVar41,auVar88);
            auVar69 = vcmpps_avx(auVar69,auVar65,1);
            local_10c0 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar77),auVar69);
            auVar96 = vfmsub213ps_fma(local_13e0,local_1000,auVar39);
            auVar77 = vfmsub213ps_fma(auVar101,auVar123,auVar42);
            auVar69 = vandps_avx(auVar39,auVar88);
            auVar65 = vandps_avx(auVar42,auVar88);
            auVar69 = vcmpps_avx(auVar69,auVar65,1);
            local_10a0 = vblendvps_avx(ZEXT1632(auVar77),ZEXT1632(auVar96),auVar69);
            auVar44._4_4_ = local_10a0._4_4_ * local_fc0;
            auVar44._0_4_ = local_10a0._0_4_ * local_fc0;
            auVar44._8_4_ = local_10a0._8_4_ * local_fc0;
            auVar44._12_4_ = local_10a0._12_4_ * local_fc0;
            auVar44._16_4_ = local_10a0._16_4_ * local_fc0;
            auVar44._20_4_ = local_10a0._20_4_ * local_fc0;
            auVar44._24_4_ = local_10a0._24_4_ * local_fc0;
            auVar44._28_4_ = auVar69._28_4_;
            auVar96 = vfmadd213ps_fma(local_13c0._0_32_,local_10c0,auVar44);
            auVar96 = vfmadd213ps_fma(local_fe0,local_10e0,ZEXT1632(auVar96));
            auVar84._0_4_ = auVar96._0_4_ + auVar96._0_4_;
            fVar74 = auVar96._4_4_ + auVar96._4_4_;
            fVar75 = auVar96._8_4_ + auVar96._8_4_;
            fVar76 = auVar96._12_4_ + auVar96._12_4_;
            auVar109 = ZEXT1632(CONCAT412(fVar76,CONCAT48(fVar75,CONCAT44(fVar74,auVar84._0_4_))));
            auVar45._4_4_ = local_10a0._4_4_ * fVar133;
            auVar45._0_4_ = local_10a0._0_4_ * fVar132;
            auVar45._8_4_ = local_10a0._8_4_ * fVar134;
            auVar45._12_4_ = local_10a0._12_4_ * auVar90._0_4_;
            auVar45._16_4_ = local_10a0._16_4_ * fVar140;
            auVar45._20_4_ = local_10a0._20_4_ * fVar143;
            auVar45._24_4_ = local_10a0._24_4_ * fVar144;
            auVar45._28_4_ = 0x7fffffff;
            auVar96 = vfmadd213ps_fma(_local_1480,local_10c0,auVar45);
            auVar69 = vrcpps_avx(auVar109);
            auVar77 = vfmadd213ps_fma(_local_1460,local_10e0,ZEXT1632(auVar96));
            auVar127._8_4_ = 0x3f800000;
            auVar127._0_8_ = 0x3f8000003f800000;
            auVar127._12_4_ = 0x3f800000;
            auVar127._16_4_ = 0x3f800000;
            auVar127._20_4_ = 0x3f800000;
            auVar127._24_4_ = 0x3f800000;
            auVar127._28_4_ = 0x3f800000;
            auVar96 = vfnmadd213ps_fma(auVar69,auVar109,auVar127);
            auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar69,auVar69);
            local_1100 = ZEXT1632(CONCAT412((auVar77._12_4_ + auVar77._12_4_) * auVar96._12_4_,
                                            CONCAT48((auVar77._8_4_ + auVar77._8_4_) * auVar96._8_4_
                                                     ,CONCAT44((auVar77._4_4_ + auVar77._4_4_) *
                                                               auVar96._4_4_,
                                                               (auVar77._0_4_ + auVar77._0_4_) *
                                                               auVar96._0_4_))));
            uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar89._4_4_ = uVar64;
            auVar89._0_4_ = uVar64;
            auVar89._8_4_ = uVar64;
            auVar89._12_4_ = uVar64;
            auVar89._16_4_ = uVar64;
            auVar89._20_4_ = uVar64;
            auVar89._24_4_ = uVar64;
            auVar89._28_4_ = uVar64;
            auVar69 = vcmpps_avx(auVar89,local_1100,2);
            fVar132 = (ray->super_RayK<1>).tfar;
            auVar107._4_4_ = fVar132;
            auVar107._0_4_ = fVar132;
            auVar107._8_4_ = fVar132;
            auVar107._12_4_ = fVar132;
            auVar107._16_4_ = fVar132;
            auVar107._20_4_ = fVar132;
            auVar107._24_4_ = fVar132;
            auVar107._28_4_ = fVar132;
            auVar65 = vcmpps_avx(local_1100,auVar107,2);
            auVar69 = vandps_avx(auVar65,auVar69);
            auVar108._0_8_ = CONCAT44(fVar74,auVar84._0_4_) ^ 0x8000000080000000;
            auVar108._8_4_ = -fVar75;
            auVar108._12_4_ = -fVar76;
            auVar108._16_4_ = 0x80000000;
            auVar108._20_4_ = 0x80000000;
            auVar108._24_4_ = 0x80000000;
            auVar108._28_4_ = 0x80000000;
            auVar65 = vcmpps_avx(auVar109,auVar108,4);
            auVar69 = vandps_avx(auVar65,auVar69);
            auVar47._8_8_ = uStack_11f8;
            auVar47._0_8_ = local_1200;
            auVar47._16_8_ = uStack_11f0;
            auVar47._24_8_ = uStack_11e8;
            auVar65 = vandps_avx(local_1040,auVar47);
            auVar69 = vpslld_avx2(auVar69,0x1f);
            auVar109 = vpsrad_avx2(auVar69,0x1f);
            auVar69 = auVar65 & auVar109;
            if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar69 >> 0x7f,0) != '\0') ||
                  (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar69 >> 0xbf,0) != '\0') ||
                (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar69[0x1f] < '\0') {
              uVar2 = *(uint *)(local_1498 + 0x18);
              uVar61 = CONCAT44(0,uVar2);
              uVar3 = *(uint *)(local_1498 + 0x1c);
              local_13c0._0_4_ = uVar3;
              auVar69 = vandps_avx(auVar109,auVar65);
              uVar55 = vextractps_avx(SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0),1)
              ;
              uStack_11d0 = 0;
              uStack_11c8 = 0;
              local_11c0 = ZEXT1632(auVar78);
              local_1180 = &local_1318;
              local_1160 = auVar69;
              pGVar54 = (context->scene->geometries).items[uVar61].ptr;
              if ((pGVar54->mask & uVar55) != 0) {
                local_12c0 = auVar69;
                auVar65 = vrcpps_avx(local_11a0);
                auVar104._8_4_ = 0x3f800000;
                auVar104._0_8_ = 0x3f8000003f800000;
                auVar104._12_4_ = 0x3f800000;
                auVar104._16_4_ = 0x3f800000;
                auVar104._20_4_ = 0x3f800000;
                auVar104._24_4_ = 0x3f800000;
                auVar104._28_4_ = 0x3f800000;
                auVar96 = vfnmadd213ps_fma(local_11a0,auVar65,auVar104);
                auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar65,auVar65);
                auVar70._8_4_ = 0x219392ef;
                auVar70._0_8_ = 0x219392ef219392ef;
                auVar70._12_4_ = 0x219392ef;
                auVar70._16_4_ = 0x219392ef;
                auVar70._20_4_ = 0x219392ef;
                auVar70._24_4_ = 0x219392ef;
                auVar70._28_4_ = 0x219392ef;
                auVar109 = vcmpps_avx(local_1080,auVar70,5);
                auVar65 = vandps_avx(auVar109,ZEXT1632(auVar96));
                auVar46._4_4_ = auVar65._4_4_ * local_11e0._4_4_;
                auVar46._0_4_ = auVar65._0_4_ * local_11e0._0_4_;
                auVar46._8_4_ = auVar65._8_4_ * local_11e0._8_4_;
                auVar46._12_4_ = auVar65._12_4_ * local_11e0._12_4_;
                auVar46._16_4_ = auVar65._16_4_ * 0.0;
                auVar46._20_4_ = auVar65._20_4_ * 0.0;
                auVar46._24_4_ = auVar65._24_4_ * 0.0;
                auVar46._28_4_ = auVar109._28_4_;
                auVar109 = vminps_avx(auVar46,auVar104);
                auVar82._0_4_ = auVar65._0_4_ * auVar78._0_4_;
                auVar82._4_4_ = auVar65._4_4_ * auVar78._4_4_;
                auVar82._8_4_ = auVar65._8_4_ * auVar78._8_4_;
                auVar82._12_4_ = auVar65._12_4_ * auVar78._12_4_;
                auVar82._16_4_ = auVar65._16_4_ * 0.0;
                auVar82._20_4_ = auVar65._20_4_ * 0.0;
                auVar82._24_4_ = auVar65._24_4_ * 0.0;
                auVar82._28_4_ = 0;
                auVar65 = vminps_avx(auVar82,auVar104);
                auVar78 = *(undefined1 (*) [16])(*local_1318 + local_1310 * 4);
                auVar96 = auVar78;
                if (2 < uVar48) {
                  auVar96 = *(undefined1 (*) [16])(*local_1318 + local_1310 * 8);
                }
                auVar77 = *local_1318;
                if (uVar51 == 2) {
                  auVar77 = vpshufd_avx(auVar77,0x54);
                  auVar78 = vpshufd_avx(auVar78,0x54);
                  auVar96 = vpshufd_avx(auVar96,0x54);
                }
                auVar110._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar77;
                auVar110._16_16_ = ZEXT116(1) * auVar78;
                auVar95._0_16_ = ZEXT116(0) * auVar96 + ZEXT116(1) * auVar78;
                auVar95._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar96;
                auVar101 = vpunpckldq_avx2(auVar110,auVar95);
                auVar117 = vpshufd_avx2(auVar110,0xa5);
                auVar126 = vpshufd_avx2(auVar95,0x94);
                auVar120 = vpsrld_avx2(auVar101,0x10);
                auVar101 = vpblendw_avx2(auVar101,ZEXT832(0) << 0x20,0xaa);
                auVar101 = vcvtdq2ps_avx(auVar101);
                auVar120 = vcvtdq2ps_avx(auVar120);
                auVar123 = vpsrld_avx2(auVar117,0x10);
                auVar117 = vpblendw_avx2(auVar117,ZEXT832(0) << 0x20,0xaa);
                auVar117 = vcvtdq2ps_avx(auVar117);
                auVar123 = vcvtdq2ps_avx(auVar123);
                auVar128 = vpsrld_avx2(auVar126,0x10);
                auVar126 = vpblendw_avx2(auVar126,ZEXT832(0) << 0x20,0xaa);
                auVar126 = vcvtdq2ps_avx(auVar126);
                auVar128 = vcvtdq2ps_avx(auVar128);
                auVar124._8_4_ = 0x3f800000;
                auVar124._0_8_ = 0x3f8000003f800000;
                auVar124._12_4_ = 0x3f800000;
                auVar124._16_4_ = 0x3f800000;
                auVar124._20_4_ = 0x3f800000;
                auVar124._24_4_ = 0x3f800000;
                auVar124._28_4_ = 0x3f800000;
                auVar118 = vsubps_avx(auVar124,auVar109);
                auVar118 = vsubps_avx(auVar118,auVar65);
                local_1140[1] =
                     auVar65._4_4_ * auVar126._4_4_ * 0.00012207031 +
                     auVar109._4_4_ * auVar117._4_4_ * 0.00012207031 +
                     auVar118._4_4_ * auVar101._4_4_ * 0.00012207031;
                local_1140[0] =
                     auVar65._0_4_ * auVar126._0_4_ * 0.00012207031 +
                     auVar109._0_4_ * auVar117._0_4_ * 0.00012207031 +
                     auVar118._0_4_ * auVar101._0_4_ * 0.00012207031;
                local_1140[2] =
                     auVar65._8_4_ * auVar126._8_4_ * 0.00012207031 +
                     auVar109._8_4_ * auVar117._8_4_ * 0.00012207031 +
                     auVar118._8_4_ * auVar101._8_4_ * 0.00012207031;
                local_1140[3] =
                     auVar65._12_4_ * auVar126._12_4_ * 0.00012207031 +
                     auVar109._12_4_ * auVar117._12_4_ * 0.00012207031 +
                     auVar118._12_4_ * auVar101._12_4_ * 0.00012207031;
                fStack_1130 = auVar65._16_4_ * auVar126._16_4_ * 0.00012207031 +
                              auVar109._16_4_ * auVar117._16_4_ * 0.00012207031 +
                              auVar118._16_4_ * auVar101._16_4_ * 0.00012207031;
                fStack_112c = auVar65._20_4_ * auVar126._20_4_ * 0.00012207031 +
                              auVar109._20_4_ * auVar117._20_4_ * 0.00012207031 +
                              auVar118._20_4_ * auVar101._20_4_ * 0.00012207031;
                fStack_1128 = auVar65._24_4_ * auVar126._24_4_ * 0.00012207031 +
                              auVar109._24_4_ * auVar117._24_4_ * 0.00012207031 +
                              auVar118._24_4_ * auVar101._24_4_ * 0.00012207031;
                fStack_1124 = auVar126._28_4_ + auVar117._28_4_ + auVar65._28_4_;
                local_1120[1] =
                     auVar128._4_4_ * 0.00012207031 * auVar65._4_4_ +
                     auVar109._4_4_ * auVar123._4_4_ * 0.00012207031 +
                     auVar118._4_4_ * auVar120._4_4_ * 0.00012207031;
                local_1120[0] =
                     auVar128._0_4_ * 0.00012207031 * auVar65._0_4_ +
                     auVar109._0_4_ * auVar123._0_4_ * 0.00012207031 +
                     auVar118._0_4_ * auVar120._0_4_ * 0.00012207031;
                local_1120[2] =
                     auVar128._8_4_ * 0.00012207031 * auVar65._8_4_ +
                     auVar109._8_4_ * auVar123._8_4_ * 0.00012207031 +
                     auVar118._8_4_ * auVar120._8_4_ * 0.00012207031;
                local_1120[3] =
                     auVar128._12_4_ * 0.00012207031 * auVar65._12_4_ +
                     auVar109._12_4_ * auVar123._12_4_ * 0.00012207031 +
                     auVar118._12_4_ * auVar120._12_4_ * 0.00012207031;
                fStack_1110 = auVar128._16_4_ * 0.00012207031 * auVar65._16_4_ +
                              auVar109._16_4_ * auVar123._16_4_ * 0.00012207031 +
                              auVar118._16_4_ * auVar120._16_4_ * 0.00012207031;
                fStack_110c = auVar128._20_4_ * 0.00012207031 * auVar65._20_4_ +
                              auVar109._20_4_ * auVar123._20_4_ * 0.00012207031 +
                              auVar118._20_4_ * auVar120._20_4_ * 0.00012207031;
                fStack_1108 = auVar128._24_4_ * 0.00012207031 * auVar65._24_4_ +
                              auVar109._24_4_ * auVar123._24_4_ * 0.00012207031 +
                              auVar118._24_4_ * auVar120._24_4_ * 0.00012207031;
                fStack_1104 = auVar117._28_4_ + auVar123._28_4_ + auVar118._28_4_;
                auVar71._8_4_ = 0x7f800000;
                auVar71._0_8_ = 0x7f8000007f800000;
                auVar71._12_4_ = 0x7f800000;
                auVar71._16_4_ = 0x7f800000;
                auVar71._20_4_ = 0x7f800000;
                auVar71._24_4_ = 0x7f800000;
                auVar71._28_4_ = 0x7f800000;
                auVar65 = vblendvps_avx(auVar71,local_1100,auVar69);
                auVar109 = vshufps_avx(auVar65,auVar65,0xb1);
                auVar109 = vminps_avx(auVar65,auVar109);
                auVar101 = vshufpd_avx(auVar109,auVar109,5);
                auVar109 = vminps_avx(auVar109,auVar101);
                auVar101 = vpermpd_avx2(auVar109,0x4e);
                auVar109 = vminps_avx(auVar109,auVar101);
                auVar65 = vcmpps_avx(auVar65,auVar109,0);
                auVar109 = auVar69 & auVar65;
                if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar109 >> 0x7f,0) != '\0') ||
                      (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar109 >> 0xbf,0) != '\0') ||
                    (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar109[0x1f] < '\0') {
                  auVar69 = vandps_avx(auVar65,auVar69);
                }
                uVar48 = vmovmskps_avx(auVar69);
                uVar51 = 0;
                for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x80000000) {
                  uVar51 = uVar51 + 1;
                }
                uVar50 = (ulong)uVar51;
                local_1460 = (undefined1  [8])context->args;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar54->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  _local_1480 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  _local_1360 = local_1100;
                  local_13e0._0_8_ = context->user;
                  local_12e0._0_8_ = uVar61;
                  local_1300._0_8_ = pGVar54;
                  do {
                    local_1384 = local_1140[uVar50];
                    local_1380 = local_1120[uVar50];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1100 + uVar50 * 4);
                    local_1390 = *(float *)(local_10e0 + uVar50 * 4);
                    local_138c = *(undefined4 *)(local_10c0 + uVar50 * 4);
                    local_1388 = *(undefined4 *)(local_10a0 + uVar50 * 4);
                    local_137c = local_13c0._0_4_;
                    local_1378 = (int)uVar61;
                    local_1374 = *(uint *)local_13e0._0_8_;
                    local_1370 = *(uint *)(local_13e0._0_8_ + 4);
                    local_1484 = -1;
                    local_1410.valid = &local_1484;
                    local_1410.geometryUserPtr = pGVar54->userPtr;
                    local_1410.context = (RTCRayQueryContext *)local_13e0._0_8_;
                    local_1410.ray = (RTCRayN *)ray;
                    local_1410.hit = (RTCHitN *)&local_1390;
                    local_1410.N = 1;
                    local_1440._0_8_ = uVar50;
                    if (pGVar54->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01931542:
                      if ((*(code **)((long)local_1460 + 0x10) != (code *)0x0) &&
                         (((*(byte *)local_1460 & 2) != 0 ||
                          (((pGVar54->field_8).field_0x2 & 0x40) != 0)))) {
                        (**(code **)((long)local_1460 + 0x10))(&local_1410);
                        pGVar54 = (Geometry *)local_1300._0_8_;
                        uVar50 = local_1440._0_8_;
                        uVar61 = local_12e0._0_8_;
                        if (*local_1410.valid == 0) goto LAB_019315fc;
                      }
                      (((Vec3f *)((long)local_1410.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1410.hit;
                      (((Vec3f *)((long)local_1410.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1410.hit + 4);
                      (((Vec3f *)((long)local_1410.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1410.hit + 8);
                      *(float *)((long)local_1410.ray + 0x3c) = *(float *)(local_1410.hit + 0xc);
                      *(float *)((long)local_1410.ray + 0x40) = *(float *)(local_1410.hit + 0x10);
                      *(float *)((long)local_1410.ray + 0x44) = *(float *)(local_1410.hit + 0x14);
                      *(float *)((long)local_1410.ray + 0x48) = *(float *)(local_1410.hit + 0x18);
                      *(float *)((long)local_1410.ray + 0x4c) = *(float *)(local_1410.hit + 0x1c);
                      *(float *)((long)local_1410.ray + 0x50) = *(float *)(local_1410.hit + 0x20);
                    }
                    else {
                      (*pGVar54->intersectionFilterN)(&local_1410);
                      pGVar54 = (Geometry *)local_1300._0_8_;
                      uVar50 = local_1440._0_8_;
                      uVar61 = local_12e0._0_8_;
                      if (*local_1410.valid != 0) goto LAB_01931542;
LAB_019315fc:
                      (ray->super_RayK<1>).tfar = (float)local_1480._0_4_;
                      pGVar54 = (Geometry *)local_1300._0_8_;
                      uVar50 = local_1440._0_8_;
                      uVar61 = local_12e0._0_8_;
                    }
                    *(undefined4 *)(local_12c0 + uVar50 * 4) = 0;
                    auVar109 = local_12c0;
                    fVar132 = (ray->super_RayK<1>).tfar;
                    auVar72._4_4_ = fVar132;
                    auVar72._0_4_ = fVar132;
                    auVar72._8_4_ = fVar132;
                    auVar72._12_4_ = fVar132;
                    auVar72._16_4_ = fVar132;
                    auVar72._20_4_ = fVar132;
                    auVar72._24_4_ = fVar132;
                    auVar72._28_4_ = fVar132;
                    auVar65 = vcmpps_avx(_local_1360,auVar72,2);
                    auVar69 = vandps_avx(auVar65,local_12c0);
                    local_12c0 = auVar69;
                    auVar109 = auVar109 & auVar65;
                    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar109 >> 0x7f,0) == '\0') &&
                          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar109 >> 0xbf,0) == '\0') &&
                        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar109[0x1f]) goto LAB_01931356;
                    auVar83._8_4_ = 0x7f800000;
                    auVar83._0_8_ = 0x7f8000007f800000;
                    auVar83._12_4_ = 0x7f800000;
                    auVar83._16_4_ = 0x7f800000;
                    auVar83._20_4_ = 0x7f800000;
                    auVar83._24_4_ = 0x7f800000;
                    auVar83._28_4_ = 0x7f800000;
                    auVar65 = vblendvps_avx(auVar83,_local_1360,auVar69);
                    auVar109 = vshufps_avx(auVar65,auVar65,0xb1);
                    auVar109 = vminps_avx(auVar65,auVar109);
                    auVar101 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar101);
                    auVar101 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar101);
                    auVar65 = vcmpps_avx(auVar65,auVar109,0);
                    auVar109 = auVar69 & auVar65;
                    _local_1480 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar109 >> 0x7f,0) != '\0') ||
                          (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar109 >> 0xbf,0) != '\0') ||
                        (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar109[0x1f] < '\0') {
                      auVar69 = vandps_avx(auVar65,auVar69);
                    }
                    uVar48 = vmovmskps_avx(auVar69);
                    uVar51 = 0;
                    for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x80000000) {
                      uVar51 = uVar51 + 1;
                    }
                    uVar50 = (ulong)uVar51;
                  } while( true );
                }
                fVar140 = local_1140[uVar50];
                fVar132 = local_1120[uVar50];
                fVar133 = *(float *)(local_10e0 + uVar50 * 4);
                fVar134 = *(float *)(local_10c0 + uVar50 * 4);
                auVar90._0_4_ = *(float *)(local_10a0 + uVar50 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_1100 + uVar50 * 4);
                (ray->Ng).field_0.field_0.x = fVar133;
                (ray->Ng).field_0.field_0.y = fVar134;
                (ray->Ng).field_0.field_0.z = auVar90._0_4_;
                ray->u = fVar140;
                ray->v = fVar132;
                ray->primID = uVar3;
                ray->geomID = uVar2;
                pRVar4 = context->user;
                ray->instID[0] = pRVar4->instID[0];
                ray->instPrimID[0] = pRVar4->instPrimID[0];
              }
            }
          }
LAB_01931356:
          fVar132 = (ray->super_RayK<1>).tfar;
          auVar73 = ZEXT1664(CONCAT412(fVar132,CONCAT48(fVar132,CONCAT44(fVar132,fVar132))));
          auVar125 = ZEXT1664(local_1210);
          auVar129 = ZEXT1664(local_1220);
          auVar131 = ZEXT1664(local_1230);
          auVar136 = ZEXT1664(local_1250);
          auVar139 = ZEXT1664(local_1260);
          auVar146 = ZEXT1664(local_1280);
          auVar154 = ZEXT1664(local_1290);
          auVar121 = ZEXT1664(local_1330);
          fVar132 = local_1240;
          fVar133 = fStack_123c;
          fVar134 = fStack_1238;
          auVar90._0_4_ = fStack_1234;
          fVar140 = local_1270;
          fVar143 = fStack_126c;
          fVar144 = fStack_1268;
          auVar84._0_4_ = fStack_1264;
        }
        else {
          local_1498 = *(long *)(uVar61 & 0xfffffffffffffff0);
          fVar75 = (float)(*(int *)(local_1498 + 8) - 1);
          fVar74 = fVar75 * (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar78 = vroundss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),9);
          auVar78 = vminss_avx(auVar78,ZEXT416((uint)(fVar75 + -1.0)));
          auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
          local_12a0 = ZEXT416((uint)(fVar74 - auVar78._0_4_));
          local_1488 = (int)auVar78._0_4_;
          lVar21 = *(long *)(local_1498 + 0x30 +
                            (ulong)*(uint *)(local_1498 + 0x2c) + (long)local_1488 * 8);
          fVar74 = (ray->super_RayK<1>).tfar;
          auVar73 = ZEXT1664(CONCAT412(fVar74,CONCAT48(fVar74,CONCAT44(fVar74,fVar74))));
          if (lVar21 != 0) {
            *(long *)*pauVar49 = lVar21;
            *(undefined4 *)(*pauVar49 + 8) = 0;
            pauVar49 = pauVar49 + 1;
          }
        }
      }
    } while (pauVar49 != (undefined1 (*) [16])&local_fa0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }